

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O2

void test_to_neg<wchar_t>
               (string *source,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *target,
               string *encoding)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  runtime_error *prVar6;
  allocator local_119;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_118;
  locale l;
  generator g;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  wstring local_88 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  booster::locale::generator::generator(&g);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                 "en_US.",encoding);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)&local_118);
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_118,source,encoding,default_method);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xcf);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source,encoding)==target");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            (&local_118,(source->_M_dataplus)._M_p,encoding,default_method);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd0);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source.c_str(),encoding)==target");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_118,pcVar2,(string *)(pcVar2 + source->_M_string_length),
             (method_type)encoding);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd1);
    poVar5 = std::operator<<(poVar5,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_118,source,&l,default_method);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd2);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source,l)==target");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_118,(source->_M_dataplus)._M_p,&l,default_method);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd3);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source.c_str(),l)==target");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  booster::locale::conv::to_utf<wchar_t>
            (&local_118,pcVar2,pcVar2 + source->_M_string_length,&l,default_method);
  _Var4 = std::operator==(&local_118,target);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd4);
    poVar5 = std::operator<<(poVar5,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target")
    ;
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_48,source,encoding,stop);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd6);
  poVar5 = std::operator<<(poVar5," to_utf<Char>(source,encoding,stop)");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
    booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
    __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>(&local_68,(source->_M_dataplus)._M_p,encoding,stop);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd7);
  poVar5 = std::operator<<(poVar5," to_utf<Char>(source.c_str(),encoding,stop)");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
    booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
    __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  error_counter = error_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            ((char *)local_88,pcVar2,(string *)(pcVar2 + source->_M_string_length),
             (method_type)encoding);
  std::__cxx11::wstring::~wstring(local_88);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd8);
  poVar5 = std::operator<<(poVar5,
                           " to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop)"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    booster::locale::conv::to_utf<wchar_t>(&local_a8,source,&l,stop);
    std::__cxx11::wstring::~wstring((wstring *)&local_a8);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd9);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source,l,stop)");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (0x14 < error_counter) {
      error_counter = error_counter + 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    booster::locale::conv::to_utf<wchar_t>(&local_c8,(source->_M_dataplus)._M_p,&l,stop);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xda);
    poVar5 = std::operator<<(poVar5," to_utf<Char>(source.c_str(),l,stop)");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (error_counter < 0x15) {
      test_counter = test_counter + 1;
      pcVar2 = (source->_M_dataplus)._M_p;
      error_counter = error_counter + 1;
      booster::locale::conv::to_utf<wchar_t>
                (&local_e8,pcVar2,pcVar2 + source->_M_string_length,&l,stop);
      std::__cxx11::wstring::~wstring((wstring *)&local_e8);
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdb);
      poVar5 = std::operator<<(poVar5,
                               " to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop)");
      std::endl<char,std::char_traits<char>>(poVar5);
      if (error_counter < 0x15) {
        error_counter = error_counter + 1;
        std::locale::~locale(&l);
        booster::locale::generator::~generator(&g);
        return;
      }
      error_counter = error_counter + 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
      booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    error_counter = error_counter + 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
    booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
    __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_118,"Error limits reached, stopping unit test",&local_119);
  booster::runtime_error::runtime_error(prVar6,(string *)&local_118);
  __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_to_neg(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(to_utf<Char>(source,encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(to_utf<Char>(source,l,stop));
    TESTF(to_utf<Char>(source.c_str(),l,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}